

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O0

void __thiscall slang::ast::TypePrinter::printAKA(TypePrinter *this,Type *type)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view str;
  string_view str_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  Type *pTVar1;
  bool bVar2;
  pointer pFVar3;
  Type *in_RSI;
  size_t in_RDI;
  Type *newTarget;
  Type *target;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_000005c0;
  TypePrinter *in_stack_000005c8;
  Symbol *in_stack_000005d0;
  Type *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff78;
  FormatBuffer *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  Type *in_stack_ffffffffffffffe0;
  Type *local_18;
  
  pTVar1 = in_RSI;
  do {
    local_18 = pTVar1;
    bVar2 = Type::isAlias(local_18);
    if (!bVar2) break;
    Symbol::as<slang::ast::TypeAliasType>((Symbol *)0xc099c4);
    in_stack_ffffffffffffffe0 = DeclaredType::getType((DeclaredType *)in_stack_ffffffffffffffe0);
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      (&(in_stack_ffffffffffffffe0->super_Symbol).name);
    pTVar1 = in_stack_ffffffffffffffe0;
  } while (((!bVar2) ||
           (bVar2 = Type::isArray(in_stack_ffffffffffffff68), pTVar1 = in_stack_ffffffffffffffe0,
           bVar2)) ||
          (bVar2 = Type::isVirtualInterface((Type *)0xc09a01), pTVar1 = in_stack_ffffffffffffffe0,
          bVar2));
  if ((local_18 != in_RSI) &&
     (__x._M_str = in_stack_ffffffffffffffa0, __x._M_len = in_stack_ffffffffffffff98,
     __y._M_str = in_stack_ffffffffffffff90, __y._M_len = in_RDI, bVar2 = std::operator==(__x,__y),
     ((bVar2 ^ 0xffU) & 1) != 0)) {
    pFVar3 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
             operator->((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                         *)0xc09a92);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78);
    str._M_str = in_stack_ffffffffffffff90;
    str._M_len = in_RDI;
    FormatBuffer::append(in_stack_ffffffffffffff80,str);
    sv((char *)pFVar3,(size_t)in_stack_ffffffffffffff68);
    Symbol::visit<slang::ast::TypePrinter&,std::basic_string_view<char,std::char_traits<char>>>
              (in_stack_000005d0,in_stack_000005c8,in_stack_000005c0);
    pFVar3 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
             operator->((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                         *)0xc09b05);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)pFVar3,(char *)local_18);
    str_00._M_str = in_stack_ffffffffffffff90;
    str_00._M_len = in_RDI;
    FormatBuffer::append(pFVar3,str_00);
  }
  return;
}

Assistant:

void TypePrinter::printAKA(const Type& type) {
    // Only print the AKA if the target type has a real name.
    // The typedefs can chain, so we want to walk down the chain
    // and take the last named type we see.
    const Type* target = &type;
    while (target->isAlias()) {
        const Type& newTarget = target->as<TypeAliasType>().targetType.getType();
        if (newTarget.name.empty() && !newTarget.isArray() && !newTarget.isVirtualInterface())
            break;

        target = &newTarget;
    }

    if (target != &type && target->name != type.name) {
        buffer->append(" (aka '");
        target->visit(*this, ""sv);
        buffer->append("')");
    }
}